

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_SetPointerPluginTest_installTooMuchFunctionPointer_Test::testBody
          (TEST_SetPointerPluginTest_installTooMuchFunctionPointer_Test *this)

{
  TestRegistry *pTVar1;
  size_t sVar2;
  UtestShell *this_00;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  
  this_00 = (UtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x7f);
  UtestShell::UtestShell(this_00);
  this_00->_vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_00352438;
  *(undefined4 *)&this_00->field_0x34 = 0x21;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[5])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pUVar3 = UtestShell::getCurrent();
  sVar2 = ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_)->failureCount_;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,sVar2,"LONGS_EQUAL(1, result_->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x84,pTVar4);
  (*this_00->_vptr_UtestShell[1])(this_00);
  return;
}

Assistant:

TEST(SetPointerPluginTest, installTooMuchFunctionPointer)
{
    MaxFunctionPointerUtestShell *tst = new MaxFunctionPointerUtestShell(SetPointerPlugin::MAX_SET + 1);
    myRegistry_->addTest(tst);

    myRegistry_->runAllTests(*result_);

    LONGS_EQUAL(1, result_->getFailureCount());
    delete tst;
}